

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceTest_TestNonZeroIntMapEntriesPopulatedInReflection_Test::
~NoFieldPresenceTest_TestNonZeroIntMapEntriesPopulatedInReflection_Test
          (NoFieldPresenceTest_TestNonZeroIntMapEntriesPopulatedInReflection_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, TestNonZeroIntMapEntriesPopulatedInReflection) {
  TestAllMapTypes message;
  const Reflection* r = message.GetReflection();
  const Descriptor* desc = message.GetDescriptor();

  const FieldDescriptor* field_map_int32_foreign_enum =
      desc->FindFieldByName("map_int32_foreign_enum");

  // Set nonzero values for key-value pairs and test that.
  ASSERT_NE(0, static_cast<uint32_t>(FOREIGN_BAZ));
  (*message.mutable_map_int32_foreign_enum())[99] = FOREIGN_BAZ;

  // Map entries show up on reflection.
  EXPECT_EQ(1, r->FieldSize(message, field_map_int32_foreign_enum));
  const google::protobuf::Message& enum_map_entry =
      r->GetRepeatedMessage(message, field_map_int32_foreign_enum, /*index=*/0);

  // HasField for both key and value returns true.
  EXPECT_THAT(enum_map_entry, MapEntryHasKey());
  EXPECT_THAT(enum_map_entry, MapEntryHasValue());
  EXPECT_THAT(enum_map_entry, MapEntryListFieldsSize(2));
}